

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamANCF_3333.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementBeamANCF_3333::PrecomputeInternalForceMatricesWeightsPreInt
          (ChElementBeamANCF_3333 *this)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  undefined8 uVar6;
  double dVar7;
  double dVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var9;
  long lVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_> *pCVar17;
  element_type *peVar18;
  long lVar19;
  ChMatrixNM<double,_3,_3> *pCVar20;
  Matrix3xN *pMVar21;
  double *pdVar22;
  long lVar23;
  undefined1 *puVar24;
  double *pdVar25;
  Index outer_1;
  ulong uVar26;
  variable_if_dynamic<long,__1> *pvVar27;
  long lVar28;
  Index inner;
  long lVar29;
  ulong uVar30;
  double *pdVar31;
  ulong uVar32;
  double *pdVar33;
  ActualDstType actualDst_5;
  long lVar34;
  double *pdVar35;
  Index outer;
  long lVar36;
  ActualDstType actualDst_2;
  ActualDstType actualDst;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  ChMatrixNM<double,_6,_6> D;
  ActualDstType actualDst_1;
  DstEvaluatorType dstEvaluator_1;
  ChMatrixNM<double,_3,_3> D22;
  ChMatrixNM<double,_3,_3> D11;
  MatrixNxN Sxi_D_0xi_n_Sxi_D_0xi_c_transpose;
  ChMatrixNM<double,_3,_3> D33;
  SrcEvaluatorType srcEvaluator_1;
  ChMatrix33<double> J_0xi_1;
  MatrixNxN scale;
  MatrixNx3c Sxi_D_0xi;
  ChMatrixNM<double,_9,_9> D_block;
  MatrixNx3c Sxi_D;
  double *local_d28;
  double *local_d18;
  undefined1 local_d01 [65];
  Scalar local_cc0;
  Scalar SStack_cb8;
  Scalar SStack_cb0;
  Scalar SStack_ca8;
  Scalar SStack_ca0;
  Scalar SStack_c98;
  Scalar SStack_c90;
  Scalar SStack_c88;
  Scalar local_c80;
  Scalar SStack_c78;
  Scalar SStack_c70;
  LhsNested pMStack_c68;
  Scalar SStack_c60;
  Scalar SStack_c58;
  Scalar SStack_c50;
  Scalar SStack_c48;
  Scalar local_c40;
  Scalar SStack_c38;
  Scalar SStack_c30;
  Scalar SStack_c28;
  Scalar SStack_c20;
  Scalar SStack_c18;
  Scalar SStack_c10;
  double *pdStack_c08;
  Scalar SStack_c00;
  Scalar SStack_bf8;
  Scalar SStack_bf0;
  Scalar aSStack_be8 [6];
  Matrix3xN *local_bb8;
  variable_if_dynamic<long,__1> *local_bb0;
  Matrix<double,__1,__1,_0,__1,__1> *local_ba8;
  Matrix3xN *local_ba0;
  DstXprType *local_b98;
  element_type *local_b90;
  undefined8 uStack_b88;
  double *local_b80;
  undefined8 uStack_b78;
  double *local_b70;
  double *pdStack_b68;
  element_type *local_b60;
  element_type *peStack_b58;
  undefined1 local_b50 [24];
  double *local_b38;
  variable_if_dynamic<long,__1> local_b30;
  variable_if_dynamic<long,__1> local_b28;
  Scalar local_b20;
  Transpose<Eigen::Matrix<double,_9,_3,_0,_9,_3>_> local_b18;
  Scalar local_b10;
  Matrix<double,_3,_3,_1,_3,_3> local_b08;
  undefined1 local_ac0 [8];
  Matrix<double,_3,_3,_1,_3,_3> MStack_ab8;
  double *local_a70;
  variable_if_dynamic<long,__1> vStack_a68;
  variable_if_dynamic<long,__1> vStack_a60;
  RhsNested RStack_a58;
  double dStack_a50;
  double *pdStack_a48;
  double dStack_a40;
  double *pdStack_a38;
  variable_if_dynamic<long,__1> local_a30 [2];
  double dStack_a20;
  double dStack_a18;
  double dStack_a10;
  scalar_constant_op<double> sStack_a08;
  PointerType pdStack_a00;
  double dStack_9f8;
  double *local_9f0;
  variable_if_dynamic<long,__1> avStack_9e8 [2];
  double dStack_9d8;
  double dStack_9d0;
  PointerType pdStack_9c8;
  double dStack_9c0;
  double *pdStack_9b8;
  variable_if_dynamic<long,__1> local_9b0;
  variable_if_dynamic<long,__1> vStack_9a8;
  double adStack_9a0 [4];
  scalar_constant_op<double> sStack_980;
  Matrix3xN *pMStack_978;
  double local_970;
  double *pdStack_968;
  variable_if_dynamic<long,__1> vStack_960;
  variable_if_dynamic<long,__1> vStack_958;
  double dStack_950;
  double dStack_948;
  Matrix3xN *pMStack_940;
  double dStack_938;
  double *local_930;
  variable_if_dynamic<long,__1> vStack_928;
  variable_if_dynamic<long,__1> vStack_920;
  double dStack_918;
  double local_910 [9];
  double adStack_8c8 [9];
  double local_880 [10];
  ulong local_830;
  ulong local_828;
  ulong local_820;
  ulong local_818;
  DstXprType *local_810;
  Scalar local_808;
  Scalar local_800;
  Scalar local_7f8;
  Scalar local_7f0;
  Scalar local_7e8;
  Scalar local_7e0;
  Scalar local_7d8;
  double local_7d0;
  Product<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_Eigen::Block<Eigen::Matrix<double,_9,_9,_1,_9,_9>,_3,_3,_false>,_0>
  local_7c8;
  Transpose<Eigen::Matrix<double,_9,_3,_0,_9,_3>_> local_790;
  Matrix<double,_3,_3,_1,_3,_3> local_788;
  DstXprType local_740;
  undefined1 local_4b0 [216];
  Matrix<double,_9,_9,_1,_9,_9> local_3d8;
  double local_150 [36];
  
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
            ((DenseStorage<double,__1,__1,__1,_0> *)&this->m_O1,0x19a1,0x51,0x51);
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
            ((DenseStorage<double,__1,__1,__1,_0> *)&this->m_O2,0x19a1,0x51,0x51);
  local_ba8 = &this->m_K3Compact;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
            ((DenseStorage<double,__1,__1,__1,_0> *)local_ba8,0x51,9,9);
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
            ((DenseStorage<double,__1,__1,__1,_0> *)&this->m_K13Compact,0x51,9,9);
  local_ac0 = (undefined1  [8])
              (this->m_K13Compact).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
              m_storage.m_rows;
  MStack_ab8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0]
       = (double)(this->m_K13Compact).
                 super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols;
  MStack_ab8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1]
       = 0.0;
  if (-1 < (long)((ulong)MStack_ab8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                         m_storage.m_data.array[0] | (ulong)local_ac0)) {
    Eigen::internal::call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>>
              (&this->m_K13Compact,
               (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                *)local_ac0,(assign_op<double,_double> *)&local_3d8);
    local_ac0 = (undefined1  [8])
                (this->m_K3Compact).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                .m_storage.m_rows;
    MStack_ab8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [0] = (double)(this->m_K3Compact).
                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols;
    MStack_ab8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [1] = 0.0;
    if (-1 < (long)((ulong)MStack_ab8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                           m_storage.m_data.array[0] | (ulong)local_ac0)) {
      Eigen::internal::call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                (local_ba8,
                 (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                  *)local_ac0,(assign_op<double,_double> *)&local_3d8);
      local_ac0 = (undefined1  [8])
                  (this->m_O1).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_rows;
      MStack_ab8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
      [0] = (double)(this->m_O1).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                    m_storage.m_cols;
      MStack_ab8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
      [1] = 0.0;
      if (-1 < (long)((ulong)MStack_ab8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>
                             .m_storage.m_data.array[0] | (ulong)local_ac0)) {
        Eigen::internal::call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                  (&this->m_O1,
                   (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                    *)local_ac0,(assign_op<double,_double> *)&local_3d8);
        local_b60 = (this->m_material).
                    super___shared_ptr<chrono::fea::ChMaterialBeamANCF,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr;
        p_Var9 = (this->m_material).
                 super___shared_ptr<chrono::fea::ChMaterialBeamANCF,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
        if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var9->_M_use_count = p_Var9->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var9->_M_use_count = p_Var9->_M_use_count + 1;
          }
        }
        if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9);
        }
        SStack_c00 = 0.0;
        SStack_bf8 = 0.0;
        SStack_bf0 = 0.0;
        local_c40 = 0.0;
        SStack_c38 = 0.0;
        SStack_c30 = 0.0;
        SStack_c28 = 0.0;
        SStack_c18 = 0.0;
        SStack_c10 = 0.0;
        pdStack_c08 = (double *)0x0;
        local_c80 = 0.0;
        SStack_c78 = 0.0;
        SStack_c70 = 0.0;
        pMStack_c68 = (LhsNested)0x0;
        SStack_c60 = 0.0;
        SStack_c50 = 0.0;
        SStack_c48 = 0.0;
        local_cc0 = 0.0;
        SStack_cb8 = 0.0;
        SStack_cb0 = 0.0;
        SStack_ca8 = 0.0;
        SStack_ca0 = 0.0;
        SStack_c98 = 0.0;
        SStack_c88 = 0.0;
        local_d01._9_8_ = (double *)0x0;
        local_d01._17_8_ = (DstXprType *)0x0;
        local_d01._25_8_ = 0;
        local_d01._33_8_ = 0;
        local_d01._41_8_ = 0;
        local_d01._49_8_ = 0.0;
        local_d01._1_8_ =
             (local_b60->m_D0).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
             m_storage.m_data.array[0];
        local_d01._57_8_ =
             *(double *)
              ((long)(local_b60->m_D0).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                     m_storage.m_data.array + 8);
        SStack_c90 = *(double *)
                      ((long)(local_b60->m_D0).
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                             m_data.array + 0x10);
        SStack_c58 = *(double *)
                      ((long)(local_b60->m_D0).
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                             m_data.array + 0x18);
        SStack_c20 = *(double *)
                      ((long)(local_b60->m_D0).
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                             m_data.array + 0x20);
        aSStack_be8[0] =
             *(double *)
              ((long)(local_b60->m_D0).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                     m_storage.m_data.array + 0x28);
        local_ac0 = (undefined1  [8])&local_3d8;
        MStack_ab8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
        array[0] = 0.0;
        MStack_ab8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
        array[1] = 4.94065645841247e-324;
        MStack_ab8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
        array[2] = 4.94065645841247e-324;
        local_3d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.
        array[0] = (double)local_d01._1_8_;
        pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            ((CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_> *)local_ac0,
                             (Scalar *)(local_d01 + 0x29));
        pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar17,(Scalar *)(local_d01 + 0x21));
        pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar17,(Scalar *)(local_d01 + 0x29));
        pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar17,(Scalar *)(local_d01 + 9));
        pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar17,(Scalar *)(local_d01 + 0x19));
        pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar17,(Scalar *)(local_d01 + 0x21));
        pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar17,(Scalar *)(local_d01 + 0x19));
        pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar17,(Scalar *)(local_d01 + 0x11));
        pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar17,&SStack_c10);
        pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar17,aSStack_be8);
        pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar17,&SStack_bf0);
        pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar17,aSStack_be8);
        pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar17,(Scalar *)&pdStack_c08);
        pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar17,&SStack_bf8);
        pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar17,&SStack_bf0);
        pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar17,&SStack_bf8);
        pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar17,&SStack_c00);
        pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar17,&local_c40);
        pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar17,&SStack_c18);
        pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar17,&SStack_c20);
        pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar17,&SStack_c18);
        pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar17,&SStack_c38);
        pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar17,&SStack_c28);
        pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar17,&SStack_c20);
        pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar17,&SStack_c28);
        pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar17,&SStack_c30);
        pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar17,&SStack_c10);
        pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar17,aSStack_be8);
        pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar17,&SStack_bf0);
        pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar17,aSStack_be8);
        pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar17,(Scalar *)&pdStack_c08);
        pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar17,&SStack_bf8);
        pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar17,&SStack_bf0);
        pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar17,&SStack_bf8);
        pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar17,&SStack_c00);
        pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar17,(Scalar *)(local_d01 + 0x31));
        pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar17,&SStack_ca8);
        pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar17,&SStack_cb0);
        pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar17,&SStack_ca8);
        pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar17,(Scalar *)(local_d01 + 0x39));
        pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar17,&SStack_cb8);
        pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar17,&SStack_cb0);
        pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar17,&SStack_cb8);
        pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar17,&local_cc0);
        pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar17,&SStack_c70);
        pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar17,&SStack_c48);
        pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar17,&SStack_c50);
        pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar17,&SStack_c48);
        pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar17,(Scalar *)&pMStack_c68);
        pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar17,&SStack_c58);
        pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar17,&SStack_c50);
        pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar17,&SStack_c58);
        pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar17,&SStack_c60);
        pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar17,&local_c40);
        pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar17,&SStack_c18);
        pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar17,&SStack_c20);
        pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar17,&SStack_c18);
        pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar17,&SStack_c38);
        pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar17,&SStack_c28);
        pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar17,&SStack_c20);
        pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar17,&SStack_c28);
        pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar17,&SStack_c30);
        pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar17,&SStack_c70);
        pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar17,&SStack_c48);
        pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar17,&SStack_c50);
        pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar17,&SStack_c48);
        pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar17,(Scalar *)&pMStack_c68);
        pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar17,&SStack_c58);
        pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar17,&SStack_c50);
        pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar17,&SStack_c58);
        pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar17,&SStack_c60);
        pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar17,&SStack_ca0);
        pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar17,&SStack_c78);
        pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar17,&local_c80);
        pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar17,&SStack_c78);
        pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar17,&SStack_c98);
        pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar17,&SStack_c88);
        pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar17,&local_c80);
        pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar17,&SStack_c88);
        Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                  (pCVar17,&SStack_c90);
        if (((long)(((PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_> *)
                    MStack_ab8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                    m_storage.m_data.array[2])->m_storage).m_data.array +
             (long)MStack_ab8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage
                   .m_data.array[0] == 9) &&
           ((Matrix<double,_3,_3,_1,_3,_3> *)
            MStack_ab8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
            .array[1] == (Matrix<double,_3,_3,_1,_3,_3> *)0x9)) {
          if (*(long *)(DAT_00b92cb0 + 0x38) != *(long *)(DAT_00b92cb0 + 0x30)) {
            local_ba0 = &this->m_ebar0;
            local_bb8 = (Matrix3xN *)(local_4b0 + 0x90);
            local_bb0 = local_a30;
            uVar26 = 0;
            do {
              local_820 = uVar26;
              if (*(long *)(DAT_00b92cb0 + 0x20) != *(long *)(DAT_00b92cb0 + 0x18)) {
                uVar30 = 0;
                local_830 = uVar26;
                do {
                  lVar23 = *(long *)(DAT_00b92cb0 + 0x18);
                  if (*(long *)(DAT_00b92cb0 + 0x20) != lVar23) {
                    uVar32 = 0;
                    local_828 = uVar30;
                    do {
                      dVar2 = *(double *)(*(long *)(static_tables_3333 + 0x30) + uVar26 * 8);
                      dVar3 = *(double *)(*(long *)(static_tables_3333 + 0x18) + local_828 * 8);
                      dVar4 = *(double *)(*(long *)(static_tables_3333 + 0x18) + uVar32 * 8);
                      local_818 = uVar32;
                      Calc_Sxi_D(this,(MatrixNx3c *)local_150,
                                 *(double *)(*(long *)(DAT_00b92cb0 + 0x30) + uVar26 * 8),
                                 *(double *)(lVar23 + local_828 * 8),
                                 *(double *)(lVar23 + uVar32 * 8));
                      Eigen::internal::
                      generic_product_impl<Eigen::Matrix<double,3,9,1,3,9>,Eigen::Matrix<double,9,3,0,9,3>,Eigen::DenseShape,Eigen::DenseShape,8>
                      ::evalTo<Eigen::Matrix<double,3,3,1,3,3>>
                                (&local_b08,local_ba0,(Matrix<double,_9,_3,_0,_9,_3> *)local_150);
                      local_ac0 = (undefined1  [8])local_150;
                      local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                      m_storage.m_data.array[0] = (double)local_150;
                      local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                      m_storage.m_data.array[1] = (double)&local_b08;
                      Eigen::internal::
                      Assignment<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Inverse<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
                      ::run(&MStack_ab8,
                            (SrcXprType *)
                            (local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                             m_storage.m_data.array + 1),(assign_op<double,_double> *)local_b50);
                      local_a70 = (double *)local_ac0;
                      vStack_a68.m_value = (long)&MStack_ab8;
                      vStack_a60.m_value = 3;
                      lVar23 = 7;
                      pdVar25 = (double *)(local_4b0 + 0x40);
                      do {
                        dVar5 = local_b08.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                m_storage.m_data.array[lVar23 + 3];
                        auVar37._0_8_ = dVar5 * *(double *)local_ac0;
                        auVar37._8_8_ = dVar5 * *(double *)((long)local_ac0 + 8);
                        uVar6 = local_b08.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                m_storage.m_data.array[lVar23 + 6];
                        auVar49._8_8_ = uVar6;
                        auVar49._0_8_ = uVar6;
                        auVar37 = vfmadd231pd_fma(auVar37,auVar49,
                                                  *(undefined1 (*) [16])((long)local_ac0 + 0x48));
                        dVar7 = MStack_ab8.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                m_storage.m_data.array[lVar23 + -1];
                        auVar55._8_8_ = dVar7;
                        auVar55._0_8_ = dVar7;
                        auVar37 = vfmadd231pd_fma(auVar37,auVar55,
                                                  *(undefined1 (*) [16])((long)local_ac0 + 0x90));
                        *(undefined1 (*) [16])(pdVar25 + -8) = auVar37;
                        auVar38._0_8_ = dVar5 * *(double *)((long)local_ac0 + 0x10);
                        auVar38._8_8_ = dVar5 * *(double *)((long)local_ac0 + 0x18);
                        auVar37 = vfmadd231pd_fma(auVar38,auVar49,
                                                  *(undefined1 (*) [16])((long)local_ac0 + 0x58));
                        auVar37 = vfmadd231pd_fma(auVar37,auVar55,
                                                  *(undefined1 (*) [16])((long)local_ac0 + 0xa0));
                        *(undefined1 (*) [16])(pdVar25 + -6) = auVar37;
                        auVar39._0_8_ = dVar5 * *(double *)((long)local_ac0 + 0x20);
                        auVar39._8_8_ = dVar5 * *(double *)((long)local_ac0 + 0x28);
                        auVar37 = vfmadd231pd_fma(auVar39,auVar49,
                                                  *(undefined1 (*) [16])((long)local_ac0 + 0x68));
                        auVar37 = vfmadd231pd_fma(auVar37,auVar55,
                                                  *(undefined1 (*) [16])((long)local_ac0 + 0xb0));
                        *(undefined1 (*) [16])(pdVar25 + -4) = auVar37;
                        auVar40._0_8_ = dVar5 * *(double *)((long)local_ac0 + 0x30);
                        auVar40._8_8_ = dVar5 * *(double *)((long)local_ac0 + 0x38);
                        auVar37 = vfmadd231pd_fma(auVar40,auVar49,
                                                  *(undefined1 (*) [16])((long)local_ac0 + 0x78));
                        auVar37 = vfmadd231pd_fma(auVar37,auVar55,
                                                  *(undefined1 (*) [16])((long)local_ac0 + 0xc0));
                        *(undefined1 (*) [16])(pdVar25 + -2) = auVar37;
                        *pdVar25 = dVar5 * *(double *)((long)local_ac0 + 0x40) +
                                   *(double *)((long)local_ac0 + 0x88) *
                                   local_b08.
                                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                   m_storage.m_data.array[lVar23 + 6] +
                                   *(double *)((long)local_ac0 + 0xd0) *
                                   MStack_ab8.
                                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                   m_storage.m_data.array[lVar23 + -1];
                        lVar23 = lVar23 + 1;
                        pdVar25 = pdVar25 + 9;
                      } while (lVar23 != 10);
                      auVar41._8_8_ = 0;
                      auVar41._0_8_ =
                           local_b08.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                           m_storage.m_data.array[3];
                      auVar50._8_8_ = 0;
                      auVar50._0_8_ =
                           local_b08.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                           m_storage.m_data.array[4];
                      auVar56._8_8_ = 0;
                      auVar56._0_8_ =
                           local_b08.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                           m_storage.m_data.array[8];
                      auVar61._8_8_ = 0;
                      auVar61._0_8_ =
                           local_b08.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                           m_storage.m_data.array[7];
                      auVar63._8_8_ = 0;
                      auVar63._0_8_ =
                           local_b08.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                           m_storage.m_data.array[7] *
                           local_b08.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                           m_storage.m_data.array[5];
                      auVar37 = vfmsub231sd_fma(auVar63,auVar50,auVar56);
                      auVar59._8_8_ = 0;
                      auVar59._0_8_ =
                           local_b08.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                           m_storage.m_data.array[6] *
                           local_b08.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                           m_storage.m_data.array[5];
                      auVar38 = vfmsub231sd_fma(auVar59,auVar41,auVar56);
                      auVar51._8_8_ = 0;
                      auVar51._0_8_ =
                           local_b08.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                           m_storage.m_data.array[6] *
                           local_b08.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                           m_storage.m_data.array[4];
                      auVar39 = vfmsub231sd_fma(auVar51,auVar41,auVar61);
                      auVar11._8_8_ = 0x8000000000000000;
                      auVar11._0_8_ = 0x8000000000000000;
                      auVar42._8_8_ = 0;
                      auVar42._0_8_ =
                           auVar39._0_8_ *
                           local_b08.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                           m_storage.m_data.array[2] +
                           (auVar37._0_8_ *
                            local_b08.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                            m_storage.m_data.array[0] -
                           auVar38._0_8_ *
                           local_b08.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                           m_storage.m_data.array[1]);
                      auVar37 = vxorpd_avx512vl(auVar42,auVar11);
                      local_b80 = (double *)(dVar3 * dVar2 * dVar4 * auVar37._0_8_);
                      uStack_b78 = 0;
                      MStack_ab8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                      m_storage.m_data.array[1] = (double)local_b80 * 0.5;
                      MStack_ab8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                      m_storage.m_data.array[6] =
                           (local_b60->m_D0).
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                           m_data.array[0];
                      dVar2 = *(double *)
                               ((long)(local_b60->m_D0).
                                      super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                      m_storage.m_data.array + 8);
                      dVar3 = *(double *)
                               ((long)(local_b60->m_D0).
                                      super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                      m_storage.m_data.array + 0x10);
                      local_d28 = (double *)local_4b0;
                      vStack_a68.m_value = 0;
                      vStack_a60.m_value = 0;
                      RStack_a58.m_matrix = (LhsNested)0x9;
                      local_bb0->m_value = 0;
                      local_bb0[1].m_value = 0;
                      dStack_a20 = 4.44659081257122e-323;
                      pdStack_a00 = (PointerType)(local_4b0 + 0x48);
                      avStack_9e8[0].m_value = 0;
                      avStack_9e8[1].m_value = 1;
                      dStack_9d8 = 4.44659081257122e-323;
                      local_9b0.m_value = 0;
                      vStack_9a8.m_value = 1;
                      adStack_9a0[0] = 4.44659081257122e-323;
                      pMStack_978 = local_bb8;
                      vStack_960.m_value = 0;
                      vStack_958.m_value = 2;
                      dStack_950 = 4.44659081257122e-323;
                      pMStack_940 = local_bb8;
                      vStack_928.m_value = 0;
                      vStack_920.m_value = 2;
                      dStack_918 = 4.44659081257122e-323;
                      MStack_ab8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                      m_storage.m_data.array[7] = (double)local_d28;
                      local_a70 = local_d28;
                      pdStack_a48 = local_d28;
                      pdStack_a38 = local_d28;
                      sStack_a08.m_other = dVar2;
                      local_9f0 = local_d28;
                      pdStack_9c8 = pdStack_a00;
                      pdStack_9b8 = local_d28;
                      sStack_980.m_other = dVar3;
                      pdStack_968 = local_d28;
                      local_930 = local_d28;
                      Eigen::internal::
                      call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,9,9,0,9,9>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,9,1,0,9,1>const>const,Eigen::Block<Eigen::Matrix<double,9,3,0,9,3>,9,1,false>const>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,9,3,0,9,3>,9,1,false>>,0>const,Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,9,1,0,9,1>const>const,Eigen::Block<Eigen::Matrix<double,9,3,0,9,3>,9,1,false>const>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,9,3,0,9,3>,9,1,false>>,0>const>const,Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,9,1,0,9,1>const>const,Eigen::Block<Eigen::Matrix<double,9,3,0,9,3>,9,1,false>const>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,9,3,0,9,3>,9,1,false>>,0>const>const>,Eigen::internal::add_assign_op<double,double>>
                                (local_ba8,
                                 (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_9,_9,_0,_9,_9>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_9,_1,_0,_9,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_9,_1,_false>_>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_9,_1,_false>_>,_0>,_const_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_9,_1,_0,_9,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_9,_1,_false>_>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_9,_1,_false>_>,_0>_>,_const_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_9,_1,_0,_9,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_9,_1,_false>_>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_9,_1,_false>_>,_0>_>_>
                                  *)local_ac0,(add_assign_op<double,_double> *)&local_740);
                      local_b70 = local_b80;
                      pdStack_b68 = local_b80;
                      peVar18 = (element_type *)0x0;
                      do {
                        lVar23 = 0;
                        local_b90 = peVar18;
                        do {
                          local_b28.m_value = lVar23 * 3;
                          local_b50._8_8_ =
                               local_3d8.
                               super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                               m_storage.m_data.array + (long)peVar18 * 0x1b + lVar23 * 3;
                          local_b50._0_8_ = local_4b0;
                          local_b38 = (double *)&local_3d8;
                          local_b20 = 4.44659081257122e-323;
                          local_b30.m_value = (long)peVar18 * 3;
                          local_b18.m_matrix = (non_const_type)local_b50._0_8_;
                          memset((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_9,_9,_1,_9,_9>_>_>,_Eigen::internal::mul_assign_op<double,_double>,_0>
                                  *)local_ac0,0,0x288);
                          local_810 = (DstXprType *)0x3ff0000000000000;
                          Eigen::internal::
                          generic_product_impl<Eigen::Product<Eigen::Matrix<double,9,3,0,9,3>,Eigen::Block<Eigen::Matrix<double,9,9,1,9,9>,3,3,false>,0>,Eigen::Transpose<Eigen::Matrix<double,9,3,0,9,3>>,Eigen::DenseShape,Eigen::DenseShape,8>
                          ::scaleAndAddTo<Eigen::Matrix<double,9,9,1,9,9>>
                                    ((Matrix<double,_9,_9,_1,_9,_9> *)local_ac0,
                                     (Product<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_Eigen::Block<Eigen::Matrix<double,_9,_9,_1,_9,_9>,_3,_3,_false>,_0>
                                      *)local_b50,&local_b18,(Scalar *)&local_810);
                          local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                          m_storage.m_data.array[2] =
                               MStack_ab8.
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                               m_storage.m_data.array[1];
                          local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                          m_storage.m_data.array[3] =
                               MStack_ab8.
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                               m_storage.m_data.array[2];
                          local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                          m_storage.m_data.array[4] =
                               MStack_ab8.
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                               m_storage.m_data.array[3];
                          local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                          m_storage.m_data.array[5] =
                               MStack_ab8.
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                               m_storage.m_data.array[4];
                          local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                          m_storage.m_data.array[6] =
                               MStack_ab8.
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                               m_storage.m_data.array[5];
                          local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                          m_storage.m_data.array[7] =
                               MStack_ab8.
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                               m_storage.m_data.array[6];
                          local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                          m_storage.m_data.array[8] =
                               MStack_ab8.
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                               m_storage.m_data.array[7];
                          local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                          m_storage.m_data.array[9] =
                               MStack_ab8.
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                               m_storage.m_data.array[8];
                          local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                          m_storage.m_data.array[10] = (double)local_a70;
                          local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                          m_storage.m_data.array[0xb] = (double)vStack_a68.m_value;
                          local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                          m_storage.m_data.array[0xc] = (double)vStack_a60.m_value;
                          local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                          m_storage.m_data.array[0xd] = (double)RStack_a58.m_matrix;
                          local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                          m_storage.m_data.array[0xe] = dStack_a50;
                          local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                          m_storage.m_data.array[0xf] = (double)pdStack_a48;
                          local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                          m_storage.m_data.array[0x10] = dStack_a40;
                          local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                          m_storage.m_data.array[0x11] = (double)pdStack_a38;
                          local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                          m_storage.m_data.array[0x12] = (double)local_a30[0].m_value;
                          local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                          m_storage.m_data.array[0x13] = (double)local_a30[1].m_value;
                          local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                          m_storage.m_data.array[0x14] = dStack_a20;
                          local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                          m_storage.m_data.array[0x15] = dStack_a18;
                          local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                          m_storage.m_data.array[0x16] = dStack_a10;
                          local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                          m_storage.m_data.array[0x17] = sStack_a08.m_other;
                          local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                          m_storage.m_data.array[0x18] = (double)pdStack_a00;
                          local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                          m_storage.m_data.array[0x19] = dStack_9f8;
                          local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                          m_storage.m_data.array[0x1a] = (double)local_9f0;
                          local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                          m_storage.m_data.array[0x1b] = (double)avStack_9e8[0].m_value;
                          local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                          m_storage.m_data.array[0x1c] = (double)avStack_9e8[1].m_value;
                          local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                          m_storage.m_data.array[0x1d] = dStack_9d8;
                          local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                          m_storage.m_data.array[0x1e] = dStack_9d0;
                          local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                          m_storage.m_data.array[0x1f] = (double)pdStack_9c8;
                          local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                          m_storage.m_data.array[0x20] = dStack_9c0;
                          local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                          m_storage.m_data.array[0x21] = (double)pdStack_9b8;
                          local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                          m_storage.m_data.array[0x22] = (double)local_9b0.m_value;
                          local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                          m_storage.m_data.array[0x23] = (double)vStack_9a8.m_value;
                          local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                          m_storage.m_data.array[0x24] = adStack_9a0[0];
                          local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                          m_storage.m_data.array[0x25] = adStack_9a0[1];
                          local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                          m_storage.m_data.array[0x26] = adStack_9a0[2];
                          local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                          m_storage.m_data.array[0x27] = adStack_9a0[3];
                          local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                          m_storage.m_data.array[0x28] = sStack_980.m_other;
                          local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                          m_storage.m_data.array[0x29] = (double)pMStack_978;
                          local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                          m_storage.m_data.array[0x2a] = local_970;
                          local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                          m_storage.m_data.array[0x2b] = (double)pdStack_968;
                          local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                          m_storage.m_data.array[0x2c] = (double)vStack_960.m_value;
                          local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                          m_storage.m_data.array[0x2d] = (double)vStack_958.m_value;
                          local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                          m_storage.m_data.array[0x2e] = dStack_950;
                          local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                          m_storage.m_data.array[0x2f] = dStack_948;
                          local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                          m_storage.m_data.array[0x30] = (double)pMStack_940;
                          local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                          m_storage.m_data.array[0x31] = dStack_938;
                          local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                          m_storage.m_data.array[0x32] = (double)local_930;
                          local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                          m_storage.m_data.array[0x33] = (double)vStack_928.m_value;
                          local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                          m_storage.m_data.array[0x34] = (double)vStack_920.m_value;
                          local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                          m_storage.m_data.array[0x35] = dStack_918;
                          local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                          m_storage.m_data.array[0x36] = local_910[0];
                          local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                          m_storage.m_data.array[0x37] = local_910[1];
                          local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                          m_storage.m_data.array[0x38] = local_910[2];
                          local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                          m_storage.m_data.array[0x39] = local_910[3];
                          local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                          m_storage.m_data.array[0x3a] = local_910[4];
                          local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                          m_storage.m_data.array[0x3b] = local_910[5];
                          local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                          m_storage.m_data.array[0x3c] = local_910[6];
                          local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                          m_storage.m_data.array[0x3d] = local_910[7];
                          local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                          m_storage.m_data.array[0x3e] = local_910[8];
                          local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                          m_storage.m_data.array[0x3f] = adStack_8c8[0];
                          local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                          m_storage.m_data.array[0x40] = adStack_8c8[1];
                          local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                          m_storage.m_data.array[0x41] = adStack_8c8[2];
                          local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                          m_storage.m_data.array[0x42] = adStack_8c8[3];
                          local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                          m_storage.m_data.array[0x43] = adStack_8c8[4];
                          local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                          m_storage.m_data.array[0x44] = adStack_8c8[5];
                          local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                          m_storage.m_data.array[0x45] = adStack_8c8[6];
                          local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                          m_storage.m_data.array[0x46] = adStack_8c8[7];
                          local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                          m_storage.m_data.array[0x47] = adStack_8c8[8];
                          local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                          m_storage.m_data.array[0x48] = local_880[0];
                          local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                          m_storage.m_data.array[0x49] = local_880[1];
                          local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                          m_storage.m_data.array[0x4a] = local_880[2];
                          local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                          m_storage.m_data.array[0x4b] = local_880[3];
                          local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                          m_storage.m_data.array[0x4c] = local_880[4];
                          local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                          m_storage.m_data.array[0x4d] = local_880[5];
                          local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                          m_storage.m_data.array[0x4e] = local_880[6];
                          local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                          m_storage.m_data.array[0x4f] = local_880[7];
                          local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                          m_storage.m_data.array[0x50] = local_880[8];
                          local_b50._0_8_ = local_b80;
                          MStack_ab8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                          m_storage.m_data.array[2] = (double)&local_740;
                          MStack_ab8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                          m_storage.m_data.array[1] = (double)&local_788;
                          local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                          m_storage.m_data.array[0] = (double)local_ac0 * (double)local_b70;
                          local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                          m_storage.m_data.array[1] =
                               MStack_ab8.
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                               m_storage.m_data.array[0] * (double)pdStack_b68;
                          local_ac0 = (undefined1  [8])&local_810;
                          MStack_ab8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                          m_storage.m_data.array[0] = (double)local_b50;
                          local_810 = (DstXprType *)
                                      MStack_ab8.
                                      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                      m_storage.m_data.array[2];
                          Eigen::internal::
                          copy_using_evaluator_innervec_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_9,_9,_1,_9,_9>_>_>,_Eigen::internal::mul_assign_op<double,_double>,_0>,_2,_80>
                          ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_9,_9,_1,_9,_9>_>_>,_Eigen::internal::mul_assign_op<double,_double>,_0>
                                 *)local_ac0);
                          *(double *)((long)*(double *)local_ac0 + 0x280) =
                               *(double *)
                                MStack_ab8.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                m_storage.m_data.array[0] *
                               *(double *)((long)*(double *)local_ac0 + 0x280);
                          dVar3 = *(double *)(local_4b0 + lVar23 * 0x48);
                          dVar4 = *(double *)(local_4b0 + lVar23 * 0x48 + 8);
                          dVar5 = *(double *)(local_4b0 + lVar23 * 0x48 + 0x10);
                          dVar7 = *(double *)(local_4b0 + lVar23 * 0x48 + 0x18);
                          dVar13 = *(double *)(local_4b0 + lVar23 * 0x48 + 0x20);
                          dVar14 = *(double *)(local_4b0 + lVar23 * 0x48 + 0x28);
                          dVar15 = *(double *)(local_4b0 + lVar23 * 0x48 + 0x30);
                          dVar16 = *(double *)(local_4b0 + lVar23 * 0x48 + 0x38);
                          dVar2 = *(double *)(local_4b0 + lVar23 * 0x48 + 0x40);
                          lVar19 = 8;
                          pdVar25 = local_d28;
                          do {
                            dVar8 = *pdVar25;
                            local_b08.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                            m_storage.m_data.array[lVar19 + 1] = dVar3 * dVar8;
                            local_b08.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                            m_storage.m_data.array[lVar19 + 2] = dVar4 * dVar8;
                            local_b08.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                            m_storage.m_data.array[lVar19 + 3] = dVar8 * dVar5;
                            local_b08.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                            m_storage.m_data.array[lVar19 + 4] = dVar8 * dVar7;
                            local_b08.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                            m_storage.m_data.array[lVar19 + 5] = dVar8 * dVar13;
                            local_b08.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                            m_storage.m_data.array[lVar19 + 6] = dVar8 * dVar14;
                            local_b08.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                            m_storage.m_data.array[lVar19 + 7] = dVar8 * dVar15;
                            local_b08.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                            m_storage.m_data.array[lVar19 + 8] = dVar8 * dVar16;
                            MStack_ab8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                            m_storage.m_data.array[lVar19 + -1] = dVar8 * dVar2;
                            lVar19 = lVar19 + 9;
                            pdVar25 = pdVar25 + 1;
                          } while (lVar19 != 0x59);
                          lVar19 = (this->m_O1).
                                   super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                                   m_storage.m_rows;
                          pdVar25 = (this->m_O1).
                                    super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                    .m_storage.m_data + 8;
                          lVar29 = 0;
                          do {
                            lVar10 = (this->m_O1).
                                     super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                     .m_storage.m_cols;
                            lVar34 = 0;
                            pdVar22 = pdVar25;
                            do {
                              if ((lVar19 < lVar34 * 9 + 9) || (lVar10 < lVar29 * 9 + 9))
                              goto LAB_0074550f;
                              dVar2 = local_740.
                                      super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                                      m_storage.m_data.array[lVar29 + lVar34 * 9];
                              lVar36 = 0;
                              pdVar33 = pdVar22;
                              do {
                                pdVar33[-8] = dVar2 * MStack_ab8.
                                                                                                            
                                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>
                                                  .m_storage.m_data.array[lVar36 + -1] + pdVar33[-8]
                                ;
                                pdVar33[-7] = dVar2 * MStack_ab8.
                                                                                                            
                                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>
                                                  .m_storage.m_data.array[lVar36 + 8] + pdVar33[-7];
                                pdVar33[-6] = dVar2 * (double)local_a30[lVar36].m_value +
                                              pdVar33[-6];
                                pdVar33[-5] = dVar2 * (double)avStack_9e8[lVar36].m_value +
                                              pdVar33[-5];
                                pdVar33[-4] = dVar2 * adStack_9a0[lVar36] + pdVar33[-4];
                                pdVar33[-3] = dVar2 * (double)(&vStack_958)[lVar36].m_value +
                                              pdVar33[-3];
                                pdVar33[-2] = dVar2 * local_910[lVar36] + pdVar33[-2];
                                pdVar33[-1] = dVar2 * adStack_8c8[lVar36] + pdVar33[-1];
                                *pdVar33 = dVar2 * local_880[lVar36] + *pdVar33;
                                lVar36 = lVar36 + 1;
                                pdVar33 = pdVar33 + lVar19;
                              } while (lVar36 != 9);
                              lVar34 = lVar34 + 1;
                              pdVar22 = pdVar22 + 9;
                            } while (lVar34 != 9);
                            lVar29 = lVar29 + 1;
                            pdVar25 = pdVar25 + lVar19 * 9;
                          } while (lVar29 != 9);
                          lVar23 = lVar23 + 1;
                        } while (lVar23 != 3);
                        peVar18 = (element_type *)((long)&local_b90->m_rho + 1);
                        local_d28 = local_d28 + 9;
                      } while (peVar18 != (element_type *)0x3);
                      uVar32 = (ulong)((int)local_818 + 1);
                      lVar23 = *(long *)(DAT_00b92cb0 + 0x18);
                      uVar26 = local_830;
                      uVar30 = local_828;
                    } while (uVar32 < (ulong)(*(long *)(DAT_00b92cb0 + 0x20) - lVar23 >> 3));
                  }
                  uVar30 = (ulong)((int)uVar30 + 1);
                } while (uVar30 < (ulong)(*(long *)(DAT_00b92cb0 + 0x20) -
                                          *(long *)(DAT_00b92cb0 + 0x18) >> 3));
              }
              uVar26 = (ulong)((int)local_820 + 1);
            } while (uVar26 < (ulong)(*(long *)(DAT_00b92cb0 + 0x38) -
                                      *(long *)(DAT_00b92cb0 + 0x30) >> 3));
          }
          SStack_c00 = 0.0;
          SStack_bf8 = 0.0;
          SStack_bf0 = 0.0;
          aSStack_be8[0] = 0.0;
          local_c40 = 0.0;
          SStack_c38 = 0.0;
          SStack_c30 = 0.0;
          SStack_c28 = 0.0;
          SStack_c20 = 0.0;
          SStack_c18 = 0.0;
          SStack_c10 = 0.0;
          pdStack_c08 = (double *)0x0;
          local_c80 = 0.0;
          SStack_c78 = 0.0;
          SStack_c70 = 0.0;
          pMStack_c68 = (LhsNested)0x0;
          SStack_c60 = 0.0;
          SStack_c58 = 0.0;
          SStack_c50 = 0.0;
          SStack_c48 = 0.0;
          local_cc0 = 0.0;
          SStack_cb8 = 0.0;
          SStack_cb0 = 0.0;
          SStack_ca8 = 0.0;
          SStack_ca0 = 0.0;
          SStack_c98 = 0.0;
          SStack_c90 = 0.0;
          SStack_c88 = 0.0;
          local_d01._1_8_ = 0.0;
          local_d01._9_8_ = (double *)0x0;
          local_d01._17_8_ = (DstXprType *)0x0;
          local_d01._25_8_ = 0;
          local_d01._33_8_ = 0;
          local_d01._41_8_ = 0;
          local_d01._49_8_ = 0.0;
          local_d01._57_8_ = 0.0;
          peVar18 = (this->m_material).
                    super___shared_ptr<chrono::fea::ChMaterialBeamANCF,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr;
          p_Var9 = (this->m_material).
                   super___shared_ptr<chrono::fea::ChMaterialBeamANCF,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
          if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var9->_M_use_count = p_Var9->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var9->_M_use_count = p_Var9->_M_use_count + 1;
            }
          }
          pCVar20 = &peVar18->m_Dv;
          puVar24 = local_d01 + 1;
          lVar23 = 0;
          do {
            lVar19 = 0;
            do {
              *(double *)(puVar24 + lVar19 * 8) =
                   (pCVar20->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).m_storage
                   .m_data.array[lVar19];
              lVar19 = lVar19 + 1;
            } while (lVar19 != 3);
            lVar23 = lVar23 + 1;
            pCVar20 = (ChMatrixNM<double,_3,_3> *)
                      ((pCVar20->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).
                       m_storage.m_data.array + 3);
            puVar24 = puVar24 + 0x30;
          } while (lVar23 != 3);
          if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9);
          }
          local_b08.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
          array[0] = (double)local_d01._1_8_;
          local_b08.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
          array[4] = (double)local_d01._49_8_;
          local_b08.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
          array[8] = SStack_ca0;
          local_b08.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
          array[3] = SStack_c10;
          local_b08.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
          array[1] = SStack_c10;
          local_b08.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
          array[6] = local_c40;
          local_b08.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
          array[2] = local_c40;
          local_b08.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
          array[7] = SStack_c70;
          local_b08.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
          array[5] = SStack_c70;
          local_b50._0_8_ = local_d01._9_8_;
          local_b30.m_value = local_d01._57_8_;
          local_b10 = SStack_c98;
          local_b38 = pdStack_c08;
          local_b50._8_8_ = pdStack_c08;
          local_b20 = SStack_c38;
          local_b50._16_8_ = SStack_c38;
          local_b18.m_matrix = pMStack_c68;
          local_b28.m_value = (long)pMStack_c68;
          local_810 = (DstXprType *)local_d01._17_8_;
          local_7f0 = local_cc0;
          local_7d0 = SStack_c90;
          local_7f8 = SStack_c00;
          local_808 = SStack_c00;
          local_7e0 = SStack_c30;
          local_800 = SStack_c30;
          local_7d8 = SStack_c60;
          local_7e8 = SStack_c60;
          local_ac0 = (undefined1  [8])&local_3d8;
          MStack_ab8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
          array[0] = 0.0;
          MStack_ab8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
          array[1] = 4.94065645841247e-324;
          MStack_ab8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
          array[2] = 4.94065645841247e-324;
          local_3d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.
          array[0] = (double)local_d01._1_8_;
          pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              ((CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_> *)local_ac0,
                               (Scalar *)(local_d01 + 0x29));
          pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar17,(Scalar *)(local_d01 + 0x21));
          pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar17,(Scalar *)(local_d01 + 0x29));
          pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar17,(Scalar *)(local_d01 + 9));
          pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar17,(Scalar *)(local_d01 + 0x19));
          pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar17,(Scalar *)(local_d01 + 0x21));
          pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar17,(Scalar *)(local_d01 + 0x19));
          pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar17,(Scalar *)(local_d01 + 0x11));
          pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar17,&SStack_c10);
          pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar17,aSStack_be8);
          pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar17,&SStack_bf0);
          pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar17,aSStack_be8);
          pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar17,(Scalar *)&pdStack_c08);
          pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar17,&SStack_bf8);
          pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar17,&SStack_bf0);
          pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar17,&SStack_bf8);
          pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar17,&SStack_c00);
          pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar17,&local_c40);
          pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar17,&SStack_c18);
          pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar17,&SStack_c20);
          pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar17,&SStack_c18);
          pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar17,&SStack_c38);
          pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar17,&SStack_c28);
          pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar17,&SStack_c20);
          pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar17,&SStack_c28);
          pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar17,&SStack_c30);
          pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar17,&SStack_c10);
          pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar17,aSStack_be8);
          pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar17,&SStack_bf0);
          pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar17,aSStack_be8);
          pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar17,(Scalar *)&pdStack_c08);
          pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar17,&SStack_bf8);
          pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar17,&SStack_bf0);
          pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar17,&SStack_bf8);
          pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar17,&SStack_c00);
          pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar17,(Scalar *)(local_d01 + 0x31));
          pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar17,&SStack_ca8);
          pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar17,&SStack_cb0);
          pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar17,&SStack_ca8);
          pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar17,(Scalar *)(local_d01 + 0x39));
          pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar17,&SStack_cb8);
          pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar17,&SStack_cb0);
          pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar17,&SStack_cb8);
          pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar17,&local_cc0);
          pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar17,&SStack_c70);
          pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar17,&SStack_c48);
          pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar17,&SStack_c50);
          pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar17,&SStack_c48);
          pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar17,(Scalar *)&pMStack_c68);
          pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar17,&SStack_c58);
          pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar17,&SStack_c50);
          pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar17,&SStack_c58);
          pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar17,&SStack_c60);
          pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar17,&local_c40);
          pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar17,&SStack_c18);
          pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar17,&SStack_c20);
          pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar17,&SStack_c18);
          pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar17,&SStack_c38);
          pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar17,&SStack_c28);
          pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar17,&SStack_c20);
          pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar17,&SStack_c28);
          pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar17,&SStack_c30);
          pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar17,&SStack_c70);
          pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar17,&SStack_c48);
          pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar17,&SStack_c50);
          pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar17,&SStack_c48);
          pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar17,(Scalar *)&pMStack_c68);
          pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar17,&SStack_c58);
          pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar17,&SStack_c50);
          pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar17,&SStack_c58);
          pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar17,&SStack_c60);
          pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar17,&SStack_ca0);
          pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar17,&SStack_c78);
          pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar17,&local_c80);
          pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar17,&SStack_c78);
          pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar17,&SStack_c98);
          pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar17,&SStack_c88);
          pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar17,&local_c80);
          pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar17,&SStack_c88);
          Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                    (pCVar17,&SStack_c90);
          if (((long)(((PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_> *)
                      MStack_ab8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                      m_storage.m_data.array[2])->m_storage).m_data.array +
               (long)MStack_ab8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                     m_storage.m_data.array[0] == 9) &&
             ((Matrix<double,_3,_3,_1,_3,_3> *)
              MStack_ab8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
              m_data.array[1] == (Matrix<double,_3,_3,_1,_3,_3> *)0x9)) {
            lVar23 = *(long *)(DAT_00b92cb0 + 0x30);
            if (*(long *)(DAT_00b92cb0 + 0x38) != lVar23) {
              local_bb8 = &this->m_ebar0;
              pvVar27 = (variable_if_dynamic<long,__1> *)0x0;
              do {
                pMVar21 = local_bb8;
                dVar2 = *(double *)(*(long *)(static_tables_3333 + 0x30) + (long)pvVar27 * 8);
                dVar2 = dVar2 + dVar2;
                local_bb0 = pvVar27;
                Calc_Sxi_D(this,(MatrixNx3c *)local_150,*(double *)(lVar23 + (long)pvVar27 * 8),0.0,
                           0.0);
                Eigen::internal::
                generic_product_impl<Eigen::Matrix<double,3,9,1,3,9>,Eigen::Matrix<double,9,3,0,9,3>,Eigen::DenseShape,Eigen::DenseShape,8>
                ::evalTo<Eigen::Matrix<double,3,3,1,3,3>>
                          (&local_788,pMVar21,(Matrix<double,_9,_3,_0,_9,_3> *)local_150);
                local_ac0 = (undefined1  [8])local_150;
                local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.
                m_data.array[0] = (double)local_150;
                local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.
                m_data.array[1] = (double)&local_788;
                Eigen::internal::
                Assignment<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Inverse<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
                ::run(&MStack_ab8,
                      (SrcXprType *)
                      (local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                       m_storage.m_data.array + 1),(assign_op<double,_double> *)&local_7c8);
                local_a70 = (double *)local_ac0;
                vStack_a68.m_value = (long)&MStack_ab8;
                vStack_a60.m_value = 3;
                lVar23 = 7;
                pdVar25 = (double *)(local_4b0 + 0x40);
                do {
                  dVar3 = local_b08.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                          m_storage.m_data.array[lVar23 + 3];
                  auVar43._0_8_ = dVar3 * *(double *)local_ac0;
                  auVar43._8_8_ = dVar3 * *(double *)((long)local_ac0 + 8);
                  uVar6 = local_b08.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                          m_storage.m_data.array[lVar23 + 6];
                  auVar52._8_8_ = uVar6;
                  auVar52._0_8_ = uVar6;
                  auVar37 = vfmadd231pd_fma(auVar43,auVar52,
                                            *(undefined1 (*) [16])((long)local_ac0 + 0x48));
                  dVar4 = MStack_ab8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                          m_storage.m_data.array[lVar23 + -1];
                  auVar57._8_8_ = dVar4;
                  auVar57._0_8_ = dVar4;
                  auVar37 = vfmadd231pd_fma(auVar37,auVar57,
                                            *(undefined1 (*) [16])((long)local_ac0 + 0x90));
                  *(undefined1 (*) [16])(pdVar25 + -8) = auVar37;
                  auVar44._0_8_ = dVar3 * *(double *)((long)local_ac0 + 0x10);
                  auVar44._8_8_ = dVar3 * *(double *)((long)local_ac0 + 0x18);
                  auVar37 = vfmadd231pd_fma(auVar44,auVar52,
                                            *(undefined1 (*) [16])((long)local_ac0 + 0x58));
                  auVar37 = vfmadd231pd_fma(auVar37,auVar57,
                                            *(undefined1 (*) [16])((long)local_ac0 + 0xa0));
                  *(undefined1 (*) [16])(pdVar25 + -6) = auVar37;
                  auVar45._0_8_ = dVar3 * *(double *)((long)local_ac0 + 0x20);
                  auVar45._8_8_ = dVar3 * *(double *)((long)local_ac0 + 0x28);
                  auVar37 = vfmadd231pd_fma(auVar45,auVar52,
                                            *(undefined1 (*) [16])((long)local_ac0 + 0x68));
                  auVar37 = vfmadd231pd_fma(auVar37,auVar57,
                                            *(undefined1 (*) [16])((long)local_ac0 + 0xb0));
                  *(undefined1 (*) [16])(pdVar25 + -4) = auVar37;
                  auVar46._0_8_ = dVar3 * *(double *)((long)local_ac0 + 0x30);
                  auVar46._8_8_ = dVar3 * *(double *)((long)local_ac0 + 0x38);
                  auVar37 = vfmadd231pd_fma(auVar46,auVar52,
                                            *(undefined1 (*) [16])((long)local_ac0 + 0x78));
                  auVar37 = vfmadd231pd_fma(auVar37,auVar57,
                                            *(undefined1 (*) [16])((long)local_ac0 + 0xc0));
                  *(undefined1 (*) [16])(pdVar25 + -2) = auVar37;
                  *pdVar25 = dVar3 * *(double *)((long)local_ac0 + 0x40) +
                             *(double *)((long)local_ac0 + 0x88) *
                             local_b08.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                             m_storage.m_data.array[lVar23 + 6] +
                             *(double *)((long)local_ac0 + 0xd0) *
                             MStack_ab8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>
                             .m_storage.m_data.array[lVar23 + -1];
                  lVar23 = lVar23 + 1;
                  pdVar25 = pdVar25 + 9;
                } while (lVar23 != 10);
                auVar47._8_8_ = 0;
                auVar47._0_8_ =
                     local_788.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                     m_storage.m_data.array[3];
                auVar53._8_8_ = 0;
                auVar53._0_8_ =
                     local_788.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                     m_storage.m_data.array[4];
                auVar58._8_8_ = 0;
                auVar58._0_8_ =
                     local_788.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                     m_storage.m_data.array[8];
                auVar62._8_8_ = 0;
                auVar62._0_8_ =
                     local_788.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                     m_storage.m_data.array[7];
                auVar64._8_8_ = 0;
                auVar64._0_8_ =
                     local_788.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                     m_storage.m_data.array[7] *
                     local_788.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                     m_storage.m_data.array[5];
                auVar37 = vfmsub231sd_fma(auVar64,auVar53,auVar58);
                auVar60._8_8_ = 0;
                auVar60._0_8_ =
                     local_788.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                     m_storage.m_data.array[6] *
                     local_788.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                     m_storage.m_data.array[5];
                auVar38 = vfmsub231sd_fma(auVar60,auVar47,auVar58);
                auVar54._8_8_ = 0;
                auVar54._0_8_ =
                     local_788.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                     m_storage.m_data.array[6] *
                     local_788.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                     m_storage.m_data.array[4];
                auVar39 = vfmsub231sd_fma(auVar54,auVar47,auVar62);
                auVar12._8_8_ = 0x8000000000000000;
                auVar12._0_8_ = 0x8000000000000000;
                auVar48._8_8_ = 0;
                auVar48._0_8_ =
                     auVar39._0_8_ *
                     local_788.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                     m_storage.m_data.array[2] +
                     (auVar37._0_8_ *
                      local_788.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                      m_storage.m_data.array[0] -
                     auVar38._0_8_ *
                     local_788.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                     m_storage.m_data.array[1]);
                auVar37 = vxorpd_avx512vl(auVar48,auVar12);
                local_b90 = (element_type *)((dVar2 + dVar2) * auVar37._0_8_);
                uStack_b88 = 0;
                MStack_ab8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                m_data.array[1] = (double)local_b90 * 0.5;
                local_d18 = (double *)local_4b0;
                MStack_ab8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                m_data.array[4] = (double)&local_b08;
                MStack_ab8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                m_data.array[7] = (double)local_b50;
                vStack_a60.m_value = (long)&local_810;
                MStack_ab8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                m_data.array[3] = (double)local_d18;
                MStack_ab8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                m_data.array[5] = (double)local_d18;
                MStack_ab8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                m_data.array[6] = (double)local_d18;
                MStack_ab8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                m_data.array[8] = (double)local_d18;
                vStack_a68.m_value = (long)local_d18;
                RStack_a58.m_matrix = (non_const_type)local_d18;
                Eigen::internal::
                call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,9,9,1,9,9>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Product<Eigen::Matrix<double,9,3,0,9,3>,Eigen::Matrix<double,3,3,1,3,3>,0>,Eigen::Transpose<Eigen::Matrix<double,9,3,0,9,3>>,0>const,Eigen::Product<Eigen::Product<Eigen::Matrix<double,9,3,0,9,3>,Eigen::Matrix<double,3,3,1,3,3>,0>,Eigen::Transpose<Eigen::Matrix<double,9,3,0,9,3>>,0>const>const,Eigen::Product<Eigen::Product<Eigen::Matrix<double,9,3,0,9,3>,Eigen::Matrix<double,3,3,1,3,3>,0>,Eigen::Transpose<Eigen::Matrix<double,9,3,0,9,3>>,0>const>const>,Eigen::internal::add_assign_op<double,double>>
                          (local_ba8,
                           (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_9,_9,_1,_9,_9>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>,_0>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>,_0>_>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>,_0>_>_>
                            *)local_ac0,(add_assign_op<double,_double> *)&local_740);
                local_b60 = local_b90;
                peStack_b58 = local_b90;
                pMVar21 = (Matrix3xN *)0x0;
                do {
                  local_b80 = (double *)((long)pMVar21 * 3);
                  local_b70 = local_3d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>
                              .m_storage.m_data.array + (long)pMVar21 * 0x1b;
                  lVar23 = 0;
                  local_ba0 = pMVar21;
                  do {
                    local_7c8.m_rhs.
                    super_BlockImpl<Eigen::Matrix<double,_9,_9,_1,_9,_9>,_3,_3,_false,_Eigen::Dense>
                    .super_BlockImpl_dense<Eigen::Matrix<double,_9,_9,_1,_9,_9>,_3,_3,_false,_true>.
                    m_startCol.m_value = lVar23 * 3;
                    local_7c8.m_rhs.
                    super_BlockImpl<Eigen::Matrix<double,_9,_9,_1,_9,_9>,_3,_3,_false,_Eigen::Dense>
                    .super_BlockImpl_dense<Eigen::Matrix<double,_9,_9,_1,_9,_9>,_3,_3,_false,_true>.
                    super_MapBase<Eigen::Block<Eigen::Matrix<double,_9,_9,_1,_9,_9>,_3,_3,_false>,_1>
                    .
                    super_MapBase<Eigen::Block<Eigen::Matrix<double,_9,_9,_1,_9,_9>,_3,_3,_false>,_0>
                    .m_data = local_b70 + lVar23 * 3;
                    local_7c8.m_lhs = (LhsNested)local_4b0;
                    local_7c8.m_rhs.
                    super_BlockImpl<Eigen::Matrix<double,_9,_9,_1,_9,_9>,_3,_3,_false,_Eigen::Dense>
                    .super_BlockImpl_dense<Eigen::Matrix<double,_9,_9,_1,_9,_9>,_3,_3,_false,_true>.
                    m_xpr = &local_3d8;
                    local_7c8.m_rhs.
                    super_BlockImpl<Eigen::Matrix<double,_9,_9,_1,_9,_9>,_3,_3,_false,_Eigen::Dense>
                    .super_BlockImpl_dense<Eigen::Matrix<double,_9,_9,_1,_9,_9>,_3,_3,_false,_true>.
                    m_startRow.m_value = (long)local_b80;
                    local_7c8.m_rhs.
                    super_BlockImpl<Eigen::Matrix<double,_9,_9,_1,_9,_9>,_3,_3,_false,_Eigen::Dense>
                    .super_BlockImpl_dense<Eigen::Matrix<double,_9,_9,_1,_9,_9>,_3,_3,_false,_true>.
                    m_outerStride = 9;
                    local_790.m_matrix = local_7c8.m_lhs;
                    memset((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_9,_9,_1,_9,_9>_>_>,_Eigen::internal::mul_assign_op<double,_double>,_0>
                            *)local_ac0,0,0x288);
                    local_b98 = (DstXprType *)0x3ff0000000000000;
                    Eigen::internal::
                    generic_product_impl<Eigen::Product<Eigen::Matrix<double,9,3,0,9,3>,Eigen::Block<Eigen::Matrix<double,9,9,1,9,9>,3,3,false>,0>,Eigen::Transpose<Eigen::Matrix<double,9,3,0,9,3>>,Eigen::DenseShape,Eigen::DenseShape,8>
                    ::scaleAndAddTo<Eigen::Matrix<double,9,9,1,9,9>>
                              ((Matrix<double,_9,_9,_1,_9,_9> *)local_ac0,&local_7c8,&local_790,
                               (Scalar *)&local_b98);
                    local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[2] =
                         MStack_ab8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                         m_storage.m_data.array[1];
                    local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[3] =
                         MStack_ab8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                         m_storage.m_data.array[2];
                    local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[4] =
                         MStack_ab8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                         m_storage.m_data.array[3];
                    local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[5] =
                         MStack_ab8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                         m_storage.m_data.array[4];
                    local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[6] =
                         MStack_ab8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                         m_storage.m_data.array[5];
                    local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[7] =
                         MStack_ab8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                         m_storage.m_data.array[6];
                    local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[8] =
                         MStack_ab8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                         m_storage.m_data.array[7];
                    local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[9] =
                         MStack_ab8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                         m_storage.m_data.array[8];
                    local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[10] = (double)local_a70;
                    local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0xb] = (double)vStack_a68.m_value;
                    local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0xc] = (double)vStack_a60.m_value;
                    local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0xd] = (double)RStack_a58.m_matrix;
                    local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0xe] = dStack_a50;
                    local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0xf] = (double)pdStack_a48;
                    local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0x10] = dStack_a40;
                    local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0x11] = (double)pdStack_a38;
                    local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0x12] = (double)local_a30[0].m_value;
                    local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0x13] = (double)local_a30[1].m_value;
                    local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0x14] = dStack_a20;
                    local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0x15] = dStack_a18;
                    local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0x16] = dStack_a10;
                    local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0x17] = sStack_a08.m_other;
                    local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0x18] = (double)pdStack_a00;
                    local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0x19] = dStack_9f8;
                    local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0x1a] = (double)local_9f0;
                    local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0x1b] = (double)avStack_9e8[0].m_value;
                    local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0x1c] = (double)avStack_9e8[1].m_value;
                    local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0x1d] = dStack_9d8;
                    local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0x1e] = dStack_9d0;
                    local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0x1f] = (double)pdStack_9c8;
                    local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0x20] = dStack_9c0;
                    local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0x21] = (double)pdStack_9b8;
                    local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0x22] = (double)local_9b0.m_value;
                    local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0x23] = (double)vStack_9a8.m_value;
                    local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0x24] = adStack_9a0[0];
                    local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0x25] = adStack_9a0[1];
                    local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0x26] = adStack_9a0[2];
                    local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0x27] = adStack_9a0[3];
                    local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0x28] = sStack_980.m_other;
                    local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0x29] = (double)pMStack_978;
                    local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0x2a] = local_970;
                    local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0x2b] = (double)pdStack_968;
                    local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0x2c] = (double)vStack_960.m_value;
                    local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0x2d] = (double)vStack_958.m_value;
                    local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0x2e] = dStack_950;
                    local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0x2f] = dStack_948;
                    local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0x30] = (double)pMStack_940;
                    local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0x31] = dStack_938;
                    local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0x32] = (double)local_930;
                    local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0x33] = (double)vStack_928.m_value;
                    local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0x34] = (double)vStack_920.m_value;
                    local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0x35] = dStack_918;
                    local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0x36] = local_910[0];
                    local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0x37] = local_910[1];
                    local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0x38] = local_910[2];
                    local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0x39] = local_910[3];
                    local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0x3a] = local_910[4];
                    local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0x3b] = local_910[5];
                    local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0x3c] = local_910[6];
                    local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0x3d] = local_910[7];
                    local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0x3e] = local_910[8];
                    local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0x3f] = adStack_8c8[0];
                    local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0x40] = adStack_8c8[1];
                    local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0x41] = adStack_8c8[2];
                    local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0x42] = adStack_8c8[3];
                    local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0x43] = adStack_8c8[4];
                    local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0x44] = adStack_8c8[5];
                    local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0x45] = adStack_8c8[6];
                    local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0x46] = adStack_8c8[7];
                    local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0x47] = adStack_8c8[8];
                    local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0x48] = local_880[0];
                    local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0x49] = local_880[1];
                    local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0x4a] = local_880[2];
                    local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0x4b] = local_880[3];
                    local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0x4c] = local_880[4];
                    local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0x4d] = local_880[5];
                    local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0x4e] = local_880[6];
                    local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0x4f] = local_880[7];
                    local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0x50] = local_880[8];
                    local_7c8.m_lhs = (LhsNested)local_b90;
                    local_b98 = &local_740;
                    MStack_ab8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                    m_storage.m_data.array[1] = (double)local_d01;
                    local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0] = (double)local_ac0 * (double)local_b60;
                    local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[1] =
                         MStack_ab8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                         m_storage.m_data.array[0] * (double)peStack_b58;
                    local_ac0 = (undefined1  [8])&local_b98;
                    MStack_ab8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                    m_storage.m_data.array[0] = (double)&local_7c8;
                    MStack_ab8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                    m_storage.m_data.array[2] = (double)local_b98;
                    Eigen::internal::
                    copy_using_evaluator_innervec_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_9,_9,_1,_9,_9>_>_>,_Eigen::internal::mul_assign_op<double,_double>,_0>,_2,_80>
                    ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_9,_9,_1,_9,_9>_>_>,_Eigen::internal::mul_assign_op<double,_double>,_0>
                           *)local_ac0);
                    *(double *)((long)*(double *)local_ac0 + 0x280) =
                         *(double *)
                          MStack_ab8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                          m_storage.m_data.array[0] *
                         *(double *)((long)*(double *)local_ac0 + 0x280);
                    dVar3 = *(double *)(local_4b0 + lVar23 * 0x48);
                    dVar4 = *(double *)(local_4b0 + lVar23 * 0x48 + 8);
                    dVar5 = *(double *)(local_4b0 + lVar23 * 0x48 + 0x10);
                    dVar7 = *(double *)(local_4b0 + lVar23 * 0x48 + 0x18);
                    dVar13 = *(double *)(local_4b0 + lVar23 * 0x48 + 0x20);
                    dVar14 = *(double *)(local_4b0 + lVar23 * 0x48 + 0x28);
                    dVar15 = *(double *)(local_4b0 + lVar23 * 0x48 + 0x30);
                    dVar16 = *(double *)(local_4b0 + lVar23 * 0x48 + 0x38);
                    dVar2 = *(double *)(local_4b0 + lVar23 * 0x48 + 0x40);
                    lVar19 = 8;
                    pdVar25 = local_d18;
                    do {
                      dVar8 = *pdVar25;
                      local_b08.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                      m_storage.m_data.array[lVar19 + 1] = dVar3 * dVar8;
                      local_b08.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                      m_storage.m_data.array[lVar19 + 2] = dVar4 * dVar8;
                      local_b08.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                      m_storage.m_data.array[lVar19 + 3] = dVar8 * dVar5;
                      local_b08.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                      m_storage.m_data.array[lVar19 + 4] = dVar8 * dVar7;
                      local_b08.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                      m_storage.m_data.array[lVar19 + 5] = dVar8 * dVar13;
                      local_b08.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                      m_storage.m_data.array[lVar19 + 6] = dVar8 * dVar14;
                      local_b08.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                      m_storage.m_data.array[lVar19 + 7] = dVar8 * dVar15;
                      local_b08.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                      m_storage.m_data.array[lVar19 + 8] = dVar8 * dVar16;
                      MStack_ab8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                      m_storage.m_data.array[lVar19 + -1] = dVar8 * dVar2;
                      lVar19 = lVar19 + 9;
                      pdVar25 = pdVar25 + 1;
                    } while (lVar19 != 0x59);
                    lVar19 = (this->m_O1).
                             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                             m_storage.m_rows;
                    pdVar25 = (this->m_O1).
                              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                              m_storage.m_data + 8;
                    lVar29 = 0;
                    do {
                      lVar10 = (this->m_O1).
                               super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                               m_storage.m_cols;
                      lVar34 = 0;
                      pdVar22 = pdVar25;
                      do {
                        if ((lVar19 < lVar34 * 9 + 9) || (lVar10 < lVar29 * 9 + 9))
                        goto LAB_0074550f;
                        dVar2 = local_740.
                                super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                                m_storage.m_data.array[lVar29 + lVar34 * 9];
                        lVar36 = 0;
                        pdVar33 = pdVar22;
                        do {
                          pdVar33[-8] = dVar2 * MStack_ab8.
                                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>
                                                .m_storage.m_data.array[lVar36 + -1] + pdVar33[-8];
                          pdVar33[-7] = dVar2 * MStack_ab8.
                                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>
                                                .m_storage.m_data.array[lVar36 + 8] + pdVar33[-7];
                          pdVar33[-6] = dVar2 * (double)local_a30[lVar36].m_value + pdVar33[-6];
                          pdVar33[-5] = dVar2 * (double)avStack_9e8[lVar36].m_value + pdVar33[-5];
                          pdVar33[-4] = dVar2 * adStack_9a0[lVar36] + pdVar33[-4];
                          pdVar33[-3] = dVar2 * (double)(&vStack_958)[lVar36].m_value + pdVar33[-3];
                          pdVar33[-2] = dVar2 * local_910[lVar36] + pdVar33[-2];
                          pdVar33[-1] = dVar2 * adStack_8c8[lVar36] + pdVar33[-1];
                          *pdVar33 = dVar2 * local_880[lVar36] + *pdVar33;
                          lVar36 = lVar36 + 1;
                          pdVar33 = pdVar33 + lVar19;
                        } while (lVar36 != 9);
                        lVar34 = lVar34 + 1;
                        pdVar22 = pdVar22 + 9;
                      } while (lVar34 != 9);
                      lVar29 = lVar29 + 1;
                      pdVar25 = pdVar25 + lVar19 * 9;
                    } while (lVar29 != 9);
                    lVar23 = lVar23 + 1;
                  } while (lVar23 != 3);
                  pMVar21 = (Matrix3xN *)
                            ((long)(local_ba0->
                                   super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>).
                                   m_storage.m_data.array + 1);
                  local_d18 = local_d18 + 9;
                } while (pMVar21 != (Matrix3xN *)0x3);
                pvVar27 = (variable_if_dynamic<long,__1> *)(ulong)((int)local_bb0 + 1);
                lVar23 = *(long *)(DAT_00b92cb0 + 0x30);
              } while (pvVar27 < (variable_if_dynamic<long,__1> *)
                                 (*(long *)(DAT_00b92cb0 + 0x38) - lVar23 >> 3));
            }
            lVar23 = (this->m_O1).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                     m_storage.m_rows;
            local_b70 = (this->m_O1).
                        super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                        m_data;
            local_b90 = (element_type *)(lVar23 * 0x48);
            lVar19 = 0;
            local_b80 = (double *)0x0;
            pdVar25 = local_b70;
            do {
              lVar29 = (long)local_b80 * 9 + 9;
              lVar10 = (this->m_O1).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                       .m_storage.m_cols;
              pdVar33 = (this->m_O2).
                        super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                        m_data;
              lVar34 = (this->m_O2).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                       .m_storage.m_rows;
              pdVar22 = (double *)((long)pdVar33 + lVar34 * lVar19 + 0x40);
              lVar36 = 0;
              pdVar31 = pdVar25;
              do {
                lVar28 = lVar36 * 9 + 9;
                if ((((lVar23 < lVar28) || (lVar10 < lVar29)) || (lVar34 < lVar28)) ||
                   ((this->m_O2).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                    m_storage.m_cols < lVar29)) {
LAB_0074550f:
                  __assert_fail("startRow >= 0 && BlockRows >= 0 && startRow + BlockRows <= xpr.rows() && startCol >= 0 && BlockCols >= 0 && startCol + BlockCols <= xpr.cols()"
                                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x85,
                                "Eigen::Block<Eigen::Matrix<double, -1, -1>, 9, 9>::Block(XprType &, Index, Index) [XprType = Eigen::Matrix<double, -1, -1>, BlockRows = 9, BlockCols = 9, InnerPanel = false]"
                               );
                }
                if (local_b70 + lVar23 * (long)local_b80 * 9 ==
                    pdVar33 + (long)local_b80 * 9 * lVar34 && pdVar33 != (double *)0x0) {
                  __assert_fail("(!check_transpose_aliasing_run_time_selector <typename Derived::Scalar,blas_traits<Derived>::IsTransposed,OtherDerived> ::run(extract_data(dst), other)) && \"aliasing detected during transposition, use transposeInPlace() \" \"or evaluate the rhs into a temporary using .eval()\""
                                ,"/usr/include/eigen3/Eigen/src/Core/Transpose.h",0x1b6,
                                "static void Eigen::internal::checkTransposeAliasing_impl<Eigen::Block<Eigen::Matrix<double, -1, -1>, 9, 9>, Eigen::Transpose<Eigen::Block<Eigen::Matrix<double, -1, -1>, 9, 9>>>::run(const Derived &, const OtherDerived &) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1>, 9, 9>, OtherDerived = Eigen::Transpose<Eigen::Block<Eigen::Matrix<double, -1, -1>, 9, 9>>, MightHaveTransposeAliasing = true]"
                               );
                }
                lVar28 = 0;
                pdVar35 = pdVar22;
                do {
                  pdVar1 = pdVar31 + lVar28;
                  pdVar35[-8] = *pdVar1;
                  pdVar35[-7] = pdVar1[lVar23];
                  pdVar35[-6] = pdVar1[lVar23 * 2];
                  pdVar35[-5] = pdVar1[lVar23 * 3];
                  pdVar35[-4] = pdVar1[lVar23 * 4];
                  pdVar35[-3] = pdVar1[lVar23 * 5];
                  pdVar35[-2] = pdVar1[lVar23 * 6];
                  pdVar35[-1] = pdVar1[lVar23 * 7];
                  *pdVar35 = pdVar1[lVar23 * 8];
                  lVar28 = lVar28 + 1;
                  pdVar35 = pdVar35 + lVar34;
                } while (lVar28 != 9);
                lVar36 = lVar36 + 1;
                pdVar31 = pdVar31 + 9;
                pdVar22 = pdVar22 + 9;
              } while (lVar36 != 9);
              local_b80 = (double *)((long)local_b80 + 1);
              pdVar25 = pdVar25 + lVar23 * 9;
              lVar19 = lVar19 + 0x48;
              if (local_b80 == (double *)0x9) {
                return;
              }
            } while( true );
          }
        }
        __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                      ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x7c,
                      "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, 9, 9, 1>>::finished() [MatrixType = Eigen::Matrix<double, 9, 9, 1>]"
                     );
      }
    }
  }
  MStack_ab8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1]
       = 0.0;
  __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, PlainObjectType = Eigen::Matrix<double, -1, -1>]"
               );
}

Assistant:

void ChElementBeamANCF_3333::PrecomputeInternalForceMatricesWeightsPreInt() {
    ChQuadratureTables* GQTable = GetStaticGQTables();
    unsigned int GQ_idx_xi = NP - 1;        // Gauss-Quadrature table index for xi
    unsigned int GQ_idx_eta_zeta = NT - 1;  // Gauss-Quadrature table index for eta and zeta

    m_O1.resize(NSF * NSF, NSF * NSF);
    m_O2.resize(NSF * NSF, NSF * NSF);
    m_K3Compact.resize(NSF, NSF);
    m_K13Compact.resize(NSF, NSF);

    m_K13Compact.setZero();
    m_K3Compact.setZero();
    m_O1.setZero();

    // =============================================================================
    // =============================================================================
    // Calculate the contribution to constant matrices needed to account for the integration across the volume of the
    // beam element, excluding the Poisson effect for the Enhanced Continuum Mechanics method
    // =============================================================================
    // =============================================================================

    // Get the components of the stiffness tensor in 6x6 matrix form that exclude the Poisson effect
    const ChVectorN<double, 6>& D0 = GetMaterial()->Get_D0();
    ChMatrixNM<double, 6, 6> D;
    D.setZero();
    D.diagonal() = D0;

    // Setup the stiffness tensor in block matrix form to make it easier to iterate through all 4 subscripts
    ChMatrixNM<double, 9, 9> D_block;
    D_block << D(0, 0), D(0, 5), D(0, 4), D(0, 5), D(0, 1), D(0, 3), D(0, 4), D(0, 3), D(0, 2), D(5, 0), D(5, 5),
        D(5, 4), D(5, 5), D(5, 1), D(5, 3), D(5, 4), D(5, 3), D(5, 2), D(4, 0), D(4, 5), D(4, 4), D(4, 5), D(4, 1),
        D(4, 3), D(4, 4), D(4, 3), D(4, 2), D(5, 0), D(5, 5), D(5, 4), D(5, 5), D(5, 1), D(5, 3), D(5, 4), D(5, 3),
        D(5, 2), D(1, 0), D(1, 5), D(1, 4), D(1, 5), D(1, 1), D(1, 3), D(1, 4), D(1, 3), D(1, 2), D(3, 0), D(3, 5),
        D(3, 4), D(3, 5), D(3, 1), D(3, 3), D(3, 4), D(3, 3), D(3, 2), D(4, 0), D(4, 5), D(4, 4), D(4, 5), D(4, 1),
        D(4, 3), D(4, 4), D(4, 3), D(4, 2), D(3, 0), D(3, 5), D(3, 4), D(3, 5), D(3, 1), D(3, 3), D(3, 4), D(3, 3),
        D(3, 2), D(2, 0), D(2, 5), D(2, 4), D(2, 5), D(2, 1), D(2, 3), D(2, 4), D(2, 3), D(2, 2);

    // Pre-calculate the matrices of normalized shape function derivatives corrected for a potentially non-straight
    // reference configuration & GQ Weights times the determinate of the element Jacobian for later Calculating the
    // portion of the Selective Reduced Integration that does account for the Poisson effect
    for (unsigned int it_xi = 0; it_xi < GQTable->Lroots[GQ_idx_xi].size(); it_xi++) {
        for (unsigned int it_eta = 0; it_eta < GQTable->Lroots[GQ_idx_eta_zeta].size(); it_eta++) {
            for (unsigned int it_zeta = 0; it_zeta < GQTable->Lroots[GQ_idx_eta_zeta].size(); it_zeta++) {
                double GQ_weight = GQTable->Weight[GQ_idx_xi][it_xi] * GQTable->Weight[GQ_idx_eta_zeta][it_eta] *
                                   GQTable->Weight[GQ_idx_eta_zeta][it_zeta];
                double xi = GQTable->Lroots[GQ_idx_xi][it_xi];
                double eta = GQTable->Lroots[GQ_idx_eta_zeta][it_eta];
                double zeta = GQTable->Lroots[GQ_idx_eta_zeta][it_zeta];

                ChMatrix33<double>
                    J_0xi;         // Element Jacobian between the reference configuration and normalized configuration
                MatrixNx3c Sxi_D;  // Matrix of normalized shape function derivatives

                Calc_Sxi_D(Sxi_D, xi, eta, zeta);
                J_0xi.noalias() = m_ebar0 * Sxi_D;

                MatrixNx3c Sxi_D_0xi = Sxi_D * J_0xi.inverse();
                double GQWeight_det_J_0xi = -J_0xi.determinant() * GQ_weight;

                // Shortcut for:
                // m_K3Compact += GQWeight_det_J_0xi * 0.5 * (Sxi_D_0xi*D11*Sxi_D_0xi.transpose() + Sxi_D_0xi *
                // D22*Sxi_D_0xi.transpose() + Sxi_D_0xi * D33*Sxi_D_0xi.transpose());
                m_K3Compact += GQWeight_det_J_0xi * 0.5 *
                               (D0(0) * Sxi_D_0xi.template block<NSF, 1>(0, 0) *
                                    Sxi_D_0xi.template block<NSF, 1>(0, 0).transpose() +
                                D0(1) * Sxi_D_0xi.template block<NSF, 1>(0, 1) *
                                    Sxi_D_0xi.template block<NSF, 1>(0, 1).transpose() +
                                D0(2) * Sxi_D_0xi.template block<NSF, 1>(0, 2) *
                                    Sxi_D_0xi.template block<NSF, 1>(0, 2).transpose());

                MatrixNxN scale;
                for (unsigned int n = 0; n < 3; n++) {
                    for (unsigned int c = 0; c < 3; c++) {
                        scale = Sxi_D_0xi * D_block.block<3, 3>(3 * n, 3 * c) * Sxi_D_0xi.transpose();
                        scale *= GQWeight_det_J_0xi;

                        MatrixNxN Sxi_D_0xi_n_Sxi_D_0xi_c_transpose =
                            Sxi_D_0xi.template block<NSF, 1>(0, n) * Sxi_D_0xi.template block<NSF, 1>(0, c).transpose();
                        for (unsigned int f = 0; f < NSF; f++) {
                            for (unsigned int t = 0; t < NSF; t++) {
                                m_O1.block<NSF, NSF>(NSF * t, NSF * f) +=
                                    scale(t, f) * Sxi_D_0xi_n_Sxi_D_0xi_c_transpose;
                            }
                        }
                    }
                }
            }
        }
    }

    // =============================================================================
    // =============================================================================
    // Calculate the contribution to constant matrices needed to account for the integration across the volume of the
    // beam element, including the Poisson effect only along the beam axis (selective reduced integration) with 1 point
    // Gauss quadrature for the cross section directions
    // =============================================================================
    // =============================================================================

    // Get the components of the stiffness tensor in 6x6 matrix form that include the Poisson effect

    D.setZero();
    D.block(0, 0, 3, 3) = GetMaterial()->Get_Dv();

    // =============================================================================
    // Pull the required entries from the 4th order stiffness tensor that are needed for K3.  Note that D is written
    // in Voigt notation rather than a 4th other tensor so the correct entries from that matrix need to be pulled.
    // D11 = slice (matrix) of the 4th order tensor with last two subscripts = 1)
    // D22 = slice (matrix) of the 4th order tensor with last two subscripts = 2)
    // D33 = slice (matrix) of the 4th order tensor with last two subscripts = 3)
    // =============================================================================
    ChMatrixNM<double, 3, 3> D11;
    ChMatrixNM<double, 3, 3> D22;
    ChMatrixNM<double, 3, 3> D33;
    D11(0, 0) = D(0, 0);
    D11(1, 1) = D(1, 0);
    D11(2, 2) = D(2, 0);
    D11(1, 0) = D(5, 0);
    D11(0, 1) = D(5, 0);
    D11(2, 0) = D(4, 0);
    D11(0, 2) = D(4, 0);
    D11(2, 1) = D(3, 0);
    D11(1, 2) = D(3, 0);

    D22(0, 0) = D(0, 1);
    D22(1, 1) = D(1, 1);
    D22(2, 2) = D(2, 1);
    D22(1, 0) = D(5, 1);
    D22(0, 1) = D(5, 1);
    D22(2, 0) = D(4, 1);
    D22(0, 2) = D(4, 1);
    D22(2, 1) = D(3, 1);
    D22(1, 2) = D(3, 1);

    D33(0, 0) = D(0, 2);
    D33(1, 1) = D(1, 2);
    D33(2, 2) = D(2, 2);
    D33(1, 0) = D(5, 2);
    D33(0, 1) = D(5, 2);
    D33(2, 0) = D(4, 2);
    D33(0, 2) = D(4, 2);
    D33(2, 1) = D(3, 2);
    D33(1, 2) = D(3, 2);

    // Setup the stiffness tensor in block matrix form to make it easier to iterate through all 4 subscripts
    D_block << D(0, 0), D(0, 5), D(0, 4), D(0, 5), D(0, 1), D(0, 3), D(0, 4), D(0, 3), D(0, 2), D(5, 0), D(5, 5),
        D(5, 4), D(5, 5), D(5, 1), D(5, 3), D(5, 4), D(5, 3), D(5, 2), D(4, 0), D(4, 5), D(4, 4), D(4, 5), D(4, 1),
        D(4, 3), D(4, 4), D(4, 3), D(4, 2), D(5, 0), D(5, 5), D(5, 4), D(5, 5), D(5, 1), D(5, 3), D(5, 4), D(5, 3),
        D(5, 2), D(1, 0), D(1, 5), D(1, 4), D(1, 5), D(1, 1), D(1, 3), D(1, 4), D(1, 3), D(1, 2), D(3, 0), D(3, 5),
        D(3, 4), D(3, 5), D(3, 1), D(3, 3), D(3, 4), D(3, 3), D(3, 2), D(4, 0), D(4, 5), D(4, 4), D(4, 5), D(4, 1),
        D(4, 3), D(4, 4), D(4, 3), D(4, 2), D(3, 0), D(3, 5), D(3, 4), D(3, 5), D(3, 1), D(3, 3), D(3, 4), D(3, 3),
        D(3, 2), D(2, 0), D(2, 5), D(2, 4), D(2, 5), D(2, 1), D(2, 3), D(2, 4), D(2, 3), D(2, 2);

    // Loop over each Gauss quadrature point and sum the contribution to each constant matrix that will be used for
    // the internal force calculations
    for (unsigned int it_xi = 0; it_xi < GQTable->Lroots[GQ_idx_xi].size(); it_xi++) {
        double GQ_weight = GQTable->Weight[GQ_idx_xi][it_xi] * 2 * 2;
        double xi = GQTable->Lroots[GQ_idx_xi][it_xi];
        double eta = 0;
        double zeta = 0;

        ChMatrix33<double> J_0xi;  // Element Jacobian between the reference configuration and normalized configuration
        MatrixNx3c Sxi_D;          // Matrix of normalized shape function derivatives

        Calc_Sxi_D(Sxi_D, xi, eta, zeta);
        J_0xi.noalias() = m_ebar0 * Sxi_D;

        MatrixNx3c Sxi_D_0xi = Sxi_D * J_0xi.inverse();
        double GQWeight_det_J_0xi = -J_0xi.determinant() * GQ_weight;

        m_K3Compact += GQWeight_det_J_0xi * 0.5 *
                       (Sxi_D_0xi * D11 * Sxi_D_0xi.transpose() + Sxi_D_0xi * D22 * Sxi_D_0xi.transpose() +
                        Sxi_D_0xi * D33 * Sxi_D_0xi.transpose());

        MatrixNxN scale;
        for (unsigned int n = 0; n < 3; n++) {
            for (unsigned int c = 0; c < 3; c++) {
                scale = Sxi_D_0xi * D_block.block<3, 3>(3 * n, 3 * c) * Sxi_D_0xi.transpose();
                scale *= GQWeight_det_J_0xi;

                MatrixNxN Sxi_D_0xi_n_Sxi_D_0xi_c_transpose =
                    Sxi_D_0xi.template block<NSF, 1>(0, n) * Sxi_D_0xi.template block<NSF, 1>(0, c).transpose();
                for (unsigned int f = 0; f < NSF; f++) {
                    for (unsigned int t = 0; t < NSF; t++) {
                        m_O1.block<NSF, NSF>(NSF * t, NSF * f) += scale(t, f) * Sxi_D_0xi_n_Sxi_D_0xi_c_transpose;
                    }
                }
            }
        }
    }

    // Since O2 is just a reordered version of O1, wait until O1 is completely calculated and then generate O2 from it
    for (unsigned int f = 0; f < NSF; f++) {
        for (unsigned int t = 0; t < NSF; t++) {
            m_O2.block<NSF, NSF>(NSF * t, NSF * f) = m_O1.block<NSF, NSF>(NSF * t, NSF * f).transpose();
        }
    }
}